

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O1

int bcf_sr_seek(bcf_srs_t *readers,char *seq,int pos)

{
  bcf_sr_regions_t *reg;
  _region_t *p_Var1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  reg = readers->regions;
  if (pos == 0 && seq == (char *)0x0) {
    iVar3 = reg->nseqs;
    if (0 < (long)iVar3) {
      p_Var1 = reg->regs;
      lVar4 = 0;
      do {
        *(undefined4 *)((long)&p_Var1->creg + lVar4) = 0xffffffff;
        lVar4 = lVar4 + 0x18;
      } while ((long)iVar3 * 0x18 != lVar4);
    }
    reg->iseq = 0;
  }
  else {
    bcf_sr_regions_overlap(reg,seq,pos,pos);
    if (0 < readers->nreaders) {
      lVar4 = 0;
      lVar5 = 0;
      iVar3 = 0;
      do {
        iVar2 = _reader_seek((bcf_sr_t *)((long)&readers->readers->file + lVar4),seq,pos,0x7ffffffe)
        ;
        iVar3 = iVar3 + iVar2;
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x60;
      } while (lVar5 < readers->nreaders);
      return iVar3;
    }
  }
  return 0;
}

Assistant:

int bcf_sr_seek(bcf_srs_t *readers, const char *seq, int pos)
{
    if ( !seq && !pos )
    {
        // seek to start
        bcf_sr_seek_start(readers);
        return 0;
    }

    bcf_sr_regions_overlap(readers->regions, seq, pos, pos);
    int i, nret = 0;
    for (i=0; i<readers->nreaders; i++)
    {
        nret += _reader_seek(&readers->readers[i],seq,pos,MAX_CSI_COOR-1);
    }
    return nret;
}